

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void parlist(LexState *ls)

{
  FuncState *fs_00;
  Proto *pPVar1;
  bool bVar2;
  int iVar3;
  TString *name;
  bool bVar4;
  int local_24;
  int isvararg;
  int nparams;
  Proto *f;
  FuncState *fs;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  pPVar1 = fs_00->f;
  local_24 = 0;
  bVar2 = false;
  if ((ls->t).token != 0x29) {
    do {
      iVar3 = (ls->t).token;
      if (iVar3 == 0x118) {
        luaX_next(ls);
        bVar2 = true;
      }
      else {
        if (iVar3 != 0x123) {
          luaX_syntaxerror(ls,"<name> or \'...\' expected");
        }
        name = str_checkname(ls);
        new_localvar(ls,name);
        local_24 = local_24 + 1;
      }
      bVar4 = false;
      if (!bVar2) {
        iVar3 = testnext(ls,0x2c);
        bVar4 = iVar3 != 0;
      }
    } while (bVar4);
  }
  adjustlocalvars(ls,local_24);
  pPVar1->numparams = fs_00->nactvar;
  if (bVar2) {
    setvararg(fs_00,(uint)pPVar1->numparams);
  }
  luaK_reserveregs(fs_00,(uint)fs_00->nactvar);
  return;
}

Assistant:

static void parlist (LexState *ls) {
  /* parlist -> [ {NAME ','} (NAME | '...') ] */
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  int nparams = 0;
  int isvararg = 0;
  if (ls->t.token != ')') {  /* is 'parlist' not empty? */
    do {
      switch (ls->t.token) {
        case TK_NAME: {
          new_localvar(ls, str_checkname(ls));
          nparams++;
          break;
        }
        case TK_DOTS: {
          luaX_next(ls);
          isvararg = 1;
          break;
        }
        default: luaX_syntaxerror(ls, "<name> or '...' expected");
      }
    } while (!isvararg && testnext(ls, ','));
  }
  adjustlocalvars(ls, nparams);
  f->numparams = cast_byte(fs->nactvar);
  if (isvararg)
    setvararg(fs, f->numparams);  /* declared vararg */
  luaK_reserveregs(fs, fs->nactvar);  /* reserve registers for parameters */
}